

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void reverse_iterator_suite::iterate_array(void)

{
  bool bVar1;
  type tVar2;
  pointer ptVar3;
  reference pbVar4;
  pointer ptVar5;
  reference pbVar6;
  size_type in_RCX;
  char *pcVar7;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  basic_variable<std::allocator<char>_> *local_a80;
  basic_variable<std::allocator<char>_> *local_9a0;
  basic_variable<std::allocator<char>_> *local_8c0;
  reverse_iterator local_8b8;
  nullable local_89c;
  reverse_iterator local_898;
  bool local_879;
  reverse_iterator local_878;
  int local_85c;
  reverse_iterator local_858;
  double local_840;
  reverse_iterator local_838;
  reverse_iterator local_820;
  reverse_iterator local_808;
  reverse_iterator local_7f0;
  reverse_iterator local_7d8;
  undefined1 local_7c0 [8];
  const_reverse_iterator where_2;
  basic_variable<std::allocator<char>_> local_798;
  basic_variable<std::allocator<char>_> local_768;
  basic_variable<std::allocator<char>_> local_738;
  basic_variable<std::allocator<char>_> local_708;
  basic_variable<std::allocator<char>_> local_6d8;
  basic_variable<std::allocator<char>_> local_6a8;
  basic_variable<std::allocator<char>_> local_678;
  basic_variable<std::allocator<char>_> local_648;
  undefined1 local_618 [24];
  variable data_2;
  nullable local_5bc;
  const_reverse_iterator local_5b8;
  bool local_599;
  const_reverse_iterator local_598;
  int local_57c;
  const_reverse_iterator local_578;
  double local_560;
  const_reverse_iterator local_558;
  const_reverse_iterator local_540;
  const_reverse_iterator local_528;
  const_reverse_iterator local_510;
  const_reverse_iterator local_4f8;
  undefined1 local_4e0 [8];
  const_reverse_iterator where_1;
  basic_variable<std::allocator<char>_> local_4b8;
  basic_variable<std::allocator<char>_> local_488;
  basic_variable<std::allocator<char>_> local_458;
  basic_variable<std::allocator<char>_> local_428;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  basic_variable<std::allocator<char>_> local_368;
  undefined1 local_338 [24];
  variable data_1;
  nullable local_2dc;
  reverse_iterator local_2d8;
  bool local_2b9;
  reverse_iterator local_2b8;
  int local_29c;
  reverse_iterator local_298;
  double local_280;
  reverse_iterator local_278;
  reverse_iterator local_260;
  reverse_iterator local_248;
  reverse_iterator local_230;
  reverse_iterator local_218;
  undefined1 local_200 [8];
  reverse_iterator where;
  nullable local_1d4;
  basic_variable<std::allocator<char>_> *local_1d0;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_1d0 = &local_1c8;
  local_1d4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,&local_1d4);
  local_1d0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1d0,true);
  local_1d0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,2);
  local_1d0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1d0,3.0);
  local_1d0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,"alpha");
  local_1d0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"bravo");
  local_1d0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"charlie");
  local_1d0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"delta");
  local_48._0_8_ = &local_1c8;
  local_48._8_8_ = 8;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_8c0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_8c0 = local_8c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8c0);
  } while (local_8c0 != &local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((reverse_iterator *)local_200,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_218);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xacd,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_218);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    (ptVar3);
  boost::detail::test_impl
            ("where->is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xace,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  tVar2 = trial::dynamic::operator==(pbVar4,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("*where == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xacf,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_230,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_230);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xad1,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_230);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                    (ptVar3);
  boost::detail::test_impl
            ("where->is<u16string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xad2,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  tVar2 = trial::dynamic::operator==(pbVar4,(char16_t (*) [8])L"charlie");
  boost::detail::test_impl
            ("*where == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xad3,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_248,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_248);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xad5,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_248);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>(ptVar3)
  ;
  boost::detail::test_impl
            ("where->is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xad6,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  tVar2 = trial::dynamic::operator==(pbVar4,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("*where == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xad7,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_260,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_260);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xad9,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_260);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>(ptVar3);
  boost::detail::test_impl
            ("where->is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xada,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  tVar2 = trial::dynamic::operator==(pbVar4,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("*where == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xadb,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_278,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_278);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xadd,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_278);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>(ptVar3);
  boost::detail::test_impl
            ("where->is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xade,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  local_280 = 3.0;
  tVar2 = trial::dynamic::operator==(pbVar4,&local_280);
  boost::detail::test_impl
            ("*where == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xadf,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_298,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_298);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xae1,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_298);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>(ptVar3)
  ;
  boost::detail::test_impl
            ("where->is<integer>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xae2,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  local_29c = 2;
  tVar2 = trial::dynamic::operator==(pbVar4,&local_29c);
  boost::detail::test_impl
            ("*where == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xae3,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_2b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_2b8);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xae5,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_2b8);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>(ptVar3)
  ;
  boost::detail::test_impl
            ("where->is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xae6,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  local_2b9 = true;
  tVar2 = trial::dynamic::operator==(pbVar4,&local_2b9);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xae7,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_2d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,&local_2d8);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xae9,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_2d8);
  ptVar3 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                       *)local_200);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    (ptVar3);
  boost::detail::test_impl
            ("where->is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaea,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar4 = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                      *)local_200);
  local_2dc = null;
  tVar2 = trial::dynamic::operator==(pbVar4,&local_2dc);
  boost::detail::test_impl
            ("*where == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaeb,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            ((reverse_iterator *)&data_1.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_200,
                          (reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)&data_1.storage.field_0x28);
  pcVar7 = "void reverse_iterator_suite::iterate_array()";
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaed,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)&data_1.storage.field_0x28);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  where_1.current.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_4b8,
             (nullable *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_488,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_458,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_428,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3f8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_398,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_368,L"delta");
  local_338._0_8_ = &local_4b8;
  local_338._8_8_ = 8;
  init_00._M_len = (size_type)pcVar7;
  init_00._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10),
             (basic_array<std::allocator<char>_> *)local_338._0_8_,init_00);
  local_9a0 = (basic_variable<std::allocator<char>_> *)local_338;
  do {
    local_9a0 = local_9a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9a0);
  } while (local_9a0 != &local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((const_reverse_iterator *)local_4e0,
             (basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_4f8,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_4f8);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaf2,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_4f8);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    (ptVar5);
  boost::detail::test_impl
            ("where->is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaf3,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  tVar2 = trial::dynamic::operator==(pbVar6,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("*where == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaf4,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_510,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_510);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaf6,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_510);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                    (ptVar5);
  boost::detail::test_impl
            ("where->is<u16string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaf7,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  tVar2 = trial::dynamic::operator==(pbVar6,(char16_t (*) [8])L"charlie");
  boost::detail::test_impl
            ("*where == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaf8,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_528,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_528);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xafa,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_528);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>(ptVar5)
  ;
  boost::detail::test_impl
            ("where->is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xafb,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  tVar2 = trial::dynamic::operator==(pbVar6,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("*where == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xafc,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_540,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_540);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xafe,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_540);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>(ptVar5);
  boost::detail::test_impl
            ("where->is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xaff,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  tVar2 = trial::dynamic::operator==(pbVar6,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("*where == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb00,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_558,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_558);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb02,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_558);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>(ptVar5);
  boost::detail::test_impl
            ("where->is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb03,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  local_560 = 3.0;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_560);
  boost::detail::test_impl
            ("*where == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb04,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_578,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_578);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb06,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_578);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>(ptVar5)
  ;
  boost::detail::test_impl
            ("where->is<integer>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb07,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  local_57c = 2;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_57c);
  boost::detail::test_impl
            ("*where == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb08,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_598,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_598);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb0a,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_598);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>(ptVar5)
  ;
  boost::detail::test_impl
            ("where->is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb0b,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  local_599 = true;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_599);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb0c,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_5b8,(basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,&local_5b8);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb0e,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_5b8);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_4e0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    (ptVar5);
  boost::detail::test_impl
            ("where->is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb0f,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_4e0);
  local_5bc = null;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_5bc);
  boost::detail::test_impl
            ("*where == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb10,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            ((const_reverse_iterator *)&data_2.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  bVar1 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_4e0,
                          (reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)&data_2.storage.field_0x28);
  pcVar7 = "void reverse_iterator_suite::iterate_array()";
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb12,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)&data_2.storage.field_0x28);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  where_2.current.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_798,
             (nullable *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_768,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_738,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_708,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6a8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_678,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_648,L"delta");
  local_618._0_8_ = &local_798;
  local_618._8_8_ = 8;
  init_01._M_len = (size_type)pcVar7;
  init_01._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_618 + 0x10),
             (basic_array<std::allocator<char>_> *)local_618._0_8_,init_01);
  local_a80 = (basic_variable<std::allocator<char>_> *)local_618;
  do {
    local_a80 = local_a80 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a80);
  } while (local_a80 != &local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::crbegin
            ((const_reverse_iterator *)local_7c0,
             (basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_7d8,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_7d8);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb17,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_7d8);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    (ptVar5);
  boost::detail::test_impl
            ("where->is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb18,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  tVar2 = trial::dynamic::operator==(pbVar6,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("*where == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb19,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_7f0,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_7f0);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb1b,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_7f0);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                    (ptVar5);
  boost::detail::test_impl
            ("where->is<u16string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb1c,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  tVar2 = trial::dynamic::operator==(pbVar6,(char16_t (*) [8])L"charlie");
  boost::detail::test_impl
            ("*where == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb1d,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_808,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_808);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb1f,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_808);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>(ptVar5)
  ;
  boost::detail::test_impl
            ("where->is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb20,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  tVar2 = trial::dynamic::operator==(pbVar6,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("*where == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb21,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_820,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_820);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb23,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_820);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>(ptVar5);
  boost::detail::test_impl
            ("where->is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb24,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  tVar2 = trial::dynamic::operator==(pbVar6,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("*where == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb25,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_838,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_838);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb27,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_838);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>(ptVar5);
  boost::detail::test_impl
            ("where->is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb28,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  local_840 = 3.0;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_840);
  boost::detail::test_impl
            ("*where == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb29,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_858,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_858);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb2b,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_858);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>(ptVar5)
  ;
  boost::detail::test_impl
            ("where->is<integer>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb2c,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  local_85c = 2;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_85c);
  boost::detail::test_impl
            ("*where == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb2d,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_878,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_878);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb2f,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_878);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>(ptVar5)
  ;
  boost::detail::test_impl
            ("where->is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb30,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  local_879 = true;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_879);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb31,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_898,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_898);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb33,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_898);
  ptVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_7c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    (ptVar5);
  boost::detail::test_impl
            ("where->is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb34,"void reverse_iterator_suite::iterate_array()",bVar1);
  pbVar6 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_7c0);
  local_89c = null;
  tVar2 = trial::dynamic::operator==(pbVar6,&local_89c);
  boost::detail::test_impl
            ("*where == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb35,"void reverse_iterator_suite::iterate_array()",tVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_8b8,(basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  bVar1 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_7c0,&local_8b8);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xb37,"void reverse_iterator_suite::iterate_array()",bVar1);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_8b8);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  return;
}

Assistant:

void iterate_array()
{
    {
        variable data = array::make({ null, true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        variable::reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<u32string>());
        TRIAL_PROTOCOL_TEST(*where == U"delta");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<u16string>());
        TRIAL_PROTOCOL_TEST(*where == u"charlie");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<wstring>());
        TRIAL_PROTOCOL_TEST(*where == L"bravo");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<string>());
        TRIAL_PROTOCOL_TEST(*where == "alpha");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<real>());
        TRIAL_PROTOCOL_TEST(*where == 3.0);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<integer>());
        TRIAL_PROTOCOL_TEST(*where == 2);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<boolean>());
        TRIAL_PROTOCOL_TEST(*where == true);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<nullable>());
        TRIAL_PROTOCOL_TEST(*where == null);
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        const variable data = array::make({ null, true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        variable::const_reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<u32string>());
        TRIAL_PROTOCOL_TEST(*where == U"delta");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<u16string>());
        TRIAL_PROTOCOL_TEST(*where == u"charlie");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<wstring>());
        TRIAL_PROTOCOL_TEST(*where == L"bravo");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<string>());
        TRIAL_PROTOCOL_TEST(*where == "alpha");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<real>());
        TRIAL_PROTOCOL_TEST(*where == 3.0);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<integer>());
        TRIAL_PROTOCOL_TEST(*where == 2);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<boolean>());
        TRIAL_PROTOCOL_TEST(*where == true);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<nullable>());
        TRIAL_PROTOCOL_TEST(*where == null);
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        variable data = array::make({ null, true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        variable::const_reverse_iterator where = data.crbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<u32string>());
        TRIAL_PROTOCOL_TEST(*where == U"delta");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<u16string>());
        TRIAL_PROTOCOL_TEST(*where == u"charlie");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<wstring>());
        TRIAL_PROTOCOL_TEST(*where == L"bravo");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<string>());
        TRIAL_PROTOCOL_TEST(*where == "alpha");
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<real>());
        TRIAL_PROTOCOL_TEST(*where == 3.0);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<integer>());
        TRIAL_PROTOCOL_TEST(*where == 2);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<boolean>());
        TRIAL_PROTOCOL_TEST(*where == true);
        ++where;
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<nullable>());
        TRIAL_PROTOCOL_TEST(*where == null);
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
}